

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O0

void __thiscall QListView::QListView(QListView *this,QListViewPrivate *dd,QWidget *parent)

{
  QAbstractItemViewPrivate *in_RDX;
  QAbstractItemView *in_RSI;
  undefined8 *in_RDI;
  QListViewPrivate *d;
  QFramePrivate *in_stack_00000038;
  bool in_stack_00000043;
  WidgetAttribute in_stack_00000044;
  QWidget *in_stack_00000048;
  QWidget *in_stack_ffffffffffffffe0;
  
  QAbstractItemView::QAbstractItemView(in_RSI,in_RDX,in_stack_ffffffffffffffe0);
  *in_RDI = &PTR_metaObject_00d2e7f8;
  in_RDI[2] = &PTR__QListView_00d2eb08;
  setViewMode((QListView *)dd,parent._4_4_);
  QAbstractItemView::setSelectionMode
            ((QAbstractItemView *)in_stack_ffffffffffffffe0,(SelectionMode)((ulong)in_RDI >> 0x20));
  QWidget::setAttribute(in_stack_00000048,in_stack_00000044,in_stack_00000043);
  d_func((QListView *)0x876883);
  QFramePrivate::updateStyledFrameWidths(in_stack_00000038);
  return;
}

Assistant:

QListView::QListView(QListViewPrivate &dd, QWidget *parent)
    : QAbstractItemView(dd, parent)
{
    setViewMode(ListMode);
    setSelectionMode(SingleSelection);
    setAttribute(Qt::WA_MacShowFocusRect);
    Q_D(QListView);               // We rely on a qobject_cast for PM_DefaultFrameWidth to change
    d->updateStyledFrameWidths(); // hence we have to force an update now that the object has been constructed
}